

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::WorkflowPresetsHelper
               (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_RCX;
  Object<cmCMakePresetsGraph::WorkflowPreset> local_88;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
  *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 cmCMakePresetsErrors::INVALID_PRESETS);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::Object
                (&local_88,
                 (Object<cmCMakePresetsGraph::WorkflowPreset> *)
                 (anonymous_namespace)::WorkflowPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,(cmJSONHelperBuilder *)&local_40,
                 (ErrorGenerator *)&local_88,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::~Object(&local_88);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,&WorkflowPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&WorkflowPresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                        *)value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value, cmJSONState* state)
{
  static auto const helper = cmJSONHelperBuilder::Vector<WorkflowPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, WorkflowPresetHelper);

  return helper(out, value, state);
}